

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ViconCGStreamClient.cpp
# Opt level: O2

void __thiscall VViconCGStreamClient::CloseLog(VViconCGStreamClient *this)

{
  VCGStreamPostalService *this_00;
  char cVar1;
  scoped_lock Lock;
  unique_lock<boost::mutex> uStack_18;
  
  boost::unique_lock<boost::mutex>::unique_lock(&uStack_18,&this->m_LogMutex);
  this_00 = (this->m_pPostalService).
            super___shared_ptr<VCGStreamPostalService,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 != (VCGStreamPostalService *)0x0) {
    VCGStreamPostalService::StopService(this_00);
  }
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::ofstream::close();
  }
  boost::unique_lock<boost::mutex>::~unique_lock(&uStack_18);
  return;
}

Assistant:

void VViconCGStreamClient::CloseLog()
{
  boost::mutex::scoped_lock Lock(m_LogMutex);

  if( m_pPostalService )
  {
    m_pPostalService->StopService();
  }
  if( m_TimingLog.is_open() )
  {
    m_TimingLog.close();
  }
}